

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_11600e9::json_error::json_error
          (json_error *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message,
          optional<(anonymous_namespace)::Args> errorPath)

{
  string local_30;
  
  cmCatViews_abi_cxx11_(&local_30,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_008b86d8;
  (this->ErrorPath).super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
       super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .Begin._M_current;
  (this->ErrorPath).super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
       super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .End._M_current;
  (this->ErrorPath).super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged =
       errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
       super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged;
  *(undefined7 *)
   &(this->ErrorPath).super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>.field_0x11 =
       errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
       super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_;
  return;
}

Assistant:

json_error(std::initializer_list<cm::string_view> message,
             cm::optional<Args> errorPath = cm::nullopt)
    : std::runtime_error(cmCatViews(message))
    , ErrorPath{
      std::move(errorPath) // NOLINT(performance-move-const-arg)
    }
  {
  }